

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer_list.cpp
# Opt level: O2

void __thiscall
libtorrent::aux::peer_list::erase_peer(peer_list *this,iterator *i,torrent_state *state)

{
  bool bVar1;
  difference_type dVar2;
  size_type sVar3;
  __normal_iterator<libtorrent::aux::torrent_peer_**,_std::vector<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>_>
  __position;
  int iVar4;
  int iVar5;
  torrent_peer *p;
  _Self local_68;
  const_iterator local_48;
  
  ::std::vector<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>::
  push_back(&state->erased,i->_M_cur);
  p = *i->_M_cur;
  if ((p->field_0x1b & 0x80) != 0) {
    *(uint *)&this->field_0x60 =
         *(uint *)&this->field_0x60 & 0x80000000 | *(uint *)&this->field_0x60 - 1 & 0x7fffffff;
    p = *i->_M_cur;
  }
  bVar1 = is_connect_candidate(this,p);
  if (bVar1) {
    iVar4 = 1;
    if (1 < this->m_num_connect_candidates) {
      iVar4 = this->m_num_connect_candidates;
    }
    this->m_num_connect_candidates = iVar4 + -1;
  }
  iVar4 = this->m_round_robin;
  local_68._M_cur =
       (this->m_peers).
       super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
       .
       super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
       ._M_impl.super__Deque_impl_data._M_start._M_cur;
  local_68._M_first =
       (this->m_peers).
       super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
       .
       super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
       ._M_impl.super__Deque_impl_data._M_start._M_first;
  local_68._M_last =
       (this->m_peers).
       super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
       .
       super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
       ._M_impl.super__Deque_impl_data._M_start._M_last;
  local_68._M_node =
       (this->m_peers).
       super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
       .
       super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
       ._M_impl.super__Deque_impl_data._M_start._M_node;
  dVar2 = ::std::operator-(i,&local_68);
  iVar5 = this->m_round_robin;
  if (dVar2 < iVar4) {
    iVar5 = iVar5 + -1;
    this->m_round_robin = iVar5;
  }
  sVar3 = ::std::
          deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>::
          size((deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                *)this);
  if ((int)sVar3 <= iVar5) {
    this->m_round_robin = 0;
  }
  __position = ::std::
               __find_if<__gnu_cxx::__normal_iterator<libtorrent::aux::torrent_peer**,std::vector<libtorrent::aux::torrent_peer*,std::allocator<libtorrent::aux::torrent_peer*>>>,__gnu_cxx::__ops::_Iter_equals_val<libtorrent::aux::torrent_peer*const>>
                         ((this->m_candidate_cache).
                          super__Vector_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (this->m_candidate_cache).
                          super__Vector_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish,i->_M_cur);
  if (__position._M_current !=
      (this->m_candidate_cache).
      super__Vector_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    ::std::vector<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
    ::erase(&this->m_candidate_cache,(const_iterator)__position._M_current);
  }
  (*this->m_peer_allocator->_vptr_torrent_peer_allocator_interface[1])
            (this->m_peer_allocator,*i->_M_cur);
  local_48._M_cur = i->_M_cur;
  local_48._M_first = i->_M_first;
  local_48._M_last = i->_M_last;
  local_48._M_node = i->_M_node;
  ::std::deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>::
  erase(&local_68,
        (deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_> *)
        this,&local_48);
  return;
}

Assistant:

void peer_list::erase_peer(iterator i, torrent_state* state)
	{
		TORRENT_ASSERT(is_single_thread());
		INVARIANT_CHECK;
		TORRENT_ASSERT(i != m_peers.end());
		TORRENT_ASSERT(m_locked_peer != *i);

		state->erased.push_back(*i);
		if ((*i)->seed)
		{
			TORRENT_ASSERT(m_num_seeds > 0);
			--m_num_seeds;
		}
		if (is_connect_candidate(**i))
			update_connect_candidates(-1);
		TORRENT_ASSERT(m_num_connect_candidates < int(m_peers.size()));
		if (m_round_robin > i - m_peers.begin()) --m_round_robin;
		if (m_round_robin >= int(m_peers.size())) m_round_robin = 0;

		// if this peer is in the connect candidate
		// cache, erase it from there as well
		auto const ci = std::find(m_candidate_cache.begin(), m_candidate_cache.end(), *i);
		if (ci != m_candidate_cache.end()) m_candidate_cache.erase(ci);

		m_peer_allocator.free_peer_entry(*i);
		m_peers.erase(i);
	}